

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<toml::value_t,_toml::error_info> *
toml::detail::guess_value_type<toml::type_config>(location *loc,context<toml::type_config> *ctx)

{
  char_type_conflict cVar1;
  byte bVar2;
  bool bVar3;
  context<toml::type_config> *in_RDX;
  result<toml::value_t,_toml::error_info> *in_RDI;
  location inner;
  spec *sp;
  context<toml::type_config> *in_stack_000018d0;
  location *in_stack_000018d8;
  location *in_stack_fffffffffffff0f8;
  failure_type *f;
  region *in_stack_fffffffffffff100;
  location *in_stack_fffffffffffff118;
  location *in_stack_fffffffffffff120;
  location *plVar4;
  allocator<char> *in_stack_fffffffffffff130;
  allocator<char> *__a;
  char *in_stack_fffffffffffff138;
  allocator<char> *__s;
  undefined6 in_stack_fffffffffffff140;
  undefined1 in_stack_fffffffffffff146;
  undefined1 in_stack_fffffffffffff147;
  error_info *in_stack_fffffffffffff158;
  error_info *v;
  location *in_stack_fffffffffffff170;
  undefined6 in_stack_fffffffffffff178;
  undefined1 in_stack_fffffffffffff17e;
  undefined1 in_stack_fffffffffffff17f;
  region local_de1;
  allocator<char> local_d51 [41];
  spec *in_stack_fffffffffffff2d8;
  pointer in_stack_fffffffffffff350;
  pointer in_stack_fffffffffffff358;
  _Alloc_hider in_stack_fffffffffffff360;
  string *in_stack_fffffffffffff368;
  allocator<char> local_c79 [144];
  location local_be9 [3];
  allocator<char> local_b11 [144];
  allocator<char> local_a81 [215];
  undefined1 local_9aa;
  value_type local_9a9;
  error_info local_921;
  allocator<char> local_891 [215];
  undefined1 local_7ba;
  value_type local_7b9;
  location local_7b8;
  undefined1 local_732;
  value_type local_731;
  allocator<char> local_6a9 [144];
  allocator<char> local_619 [216];
  allocator<char> local_541 [144];
  allocator<char> local_4b1 [215];
  undefined1 local_3da;
  value_type local_3d9;
  allocator<char> local_351 [144];
  allocator<char> local_2c1 [216];
  allocator<char> local_1e9 [144];
  allocator<char> local_159 [211];
  undefined1 local_86;
  value_type local_85;
  undefined1 local_84;
  value_type local_83;
  undefined1 local_82;
  value_type local_81;
  undefined1 local_80;
  value_type local_7f;
  undefined1 local_7e;
  value_type local_7d;
  undefined4 local_7c;
  undefined1 local_76;
  value_type local_75;
  spec *local_20;
  
  local_20 = context<toml::type_config>::toml_spec(in_RDX);
  location::location(in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  cVar1 = location::current(in_stack_fffffffffffff0f8);
  switch(cVar1) {
  case '\"':
    local_76 = 4;
    local_75 = (value_type)ok<toml::value_t>((value_t *)in_stack_fffffffffffff0f8);
    result<toml::value_t,_toml::error_info>::result(in_RDI,(success_type)local_75);
    break;
  default:
    guess_number_type<toml::type_config>(in_stack_000018d8,in_stack_000018d0);
    break;
  case '\'':
    local_7e = 4;
    local_7d = (value_type)ok<toml::value_t>((value_t *)in_stack_fffffffffffff0f8);
    result<toml::value_t,_toml::error_info>::result(in_RDI,(success_type)local_7d);
    break;
  case 'F':
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff147,
                        CONCAT16(in_stack_fffffffffffff146,in_stack_fffffffffffff140)),
               in_stack_fffffffffffff138,in_stack_fffffffffffff130);
    syntax::boolean((spec *)in_stack_fffffffffffff158);
    location::location(in_stack_fffffffffffff120,in_stack_fffffffffffff118);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff147,
                        CONCAT16(in_stack_fffffffffffff146,in_stack_fffffffffffff140)),
               in_stack_fffffffffffff138,in_stack_fffffffffffff130);
    make_syntax_error<toml::detail::either>
              (in_stack_fffffffffffff368,(either *)in_stack_fffffffffffff360._M_p,
               (location *)in_stack_fffffffffffff358,(string *)in_stack_fffffffffffff350);
    err<toml::error_info>(in_stack_fffffffffffff158);
    result<toml::value_t,_toml::error_info>::result
              ((result<toml::value_t,_toml::error_info> *)in_stack_fffffffffffff100,
               (failure_type *)in_stack_fffffffffffff0f8);
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6de3b0);
    error_info::~error_info((error_info *)in_stack_fffffffffffff100);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff100);
    std::allocator<char>::~allocator(local_351);
    location::~location((location *)in_stack_fffffffffffff100);
    either::~either((either *)in_stack_fffffffffffff100);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff100);
    std::allocator<char>::~allocator(local_2c1);
    break;
  case 'I':
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff147,
                        CONCAT16(in_stack_fffffffffffff146,in_stack_fffffffffffff140)),
               in_stack_fffffffffffff138,in_stack_fffffffffffff130);
    syntax::floating(in_stack_fffffffffffff2d8);
    location::location(in_stack_fffffffffffff120,in_stack_fffffffffffff118);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff147,
                        CONCAT16(in_stack_fffffffffffff146,in_stack_fffffffffffff140)),
               in_stack_fffffffffffff138,in_stack_fffffffffffff130);
    make_syntax_error<toml::detail::either>
              (in_stack_fffffffffffff368,(either *)in_stack_fffffffffffff360._M_p,
               (location *)in_stack_fffffffffffff358,(string *)in_stack_fffffffffffff350);
    err<toml::error_info>(in_stack_fffffffffffff158);
    result<toml::value_t,_toml::error_info>::result
              ((result<toml::value_t,_toml::error_info> *)in_stack_fffffffffffff100,
               (failure_type *)in_stack_fffffffffffff0f8);
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6de96d);
    error_info::~error_info((error_info *)in_stack_fffffffffffff100);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff100);
    std::allocator<char>::~allocator(local_6a9);
    location::~location((location *)in_stack_fffffffffffff100);
    either::~either((either *)in_stack_fffffffffffff100);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff100);
    std::allocator<char>::~allocator(local_619);
    break;
  case 'N':
    if ((local_20->ext_null_value & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff147,
                          CONCAT16(in_stack_fffffffffffff146,in_stack_fffffffffffff140)),
                 in_stack_fffffffffffff138,in_stack_fffffffffffff130);
      syntax::floating(in_stack_fffffffffffff2d8);
      location::location(in_stack_fffffffffffff120,in_stack_fffffffffffff118);
      in_stack_fffffffffffff100 = &local_de1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff147,
                          CONCAT16(in_stack_fffffffffffff146,in_stack_fffffffffffff140)),
                 in_stack_fffffffffffff138,in_stack_fffffffffffff130);
      make_syntax_error<toml::detail::either>
                (in_stack_fffffffffffff368,(either *)in_stack_fffffffffffff360._M_p,
                 (location *)in_stack_fffffffffffff358,(string *)in_stack_fffffffffffff350);
      f = (failure_type *)&stack0xfffffffffffff328;
      err<toml::error_info>(in_stack_fffffffffffff158);
      result<toml::value_t,_toml::error_info>::result
                ((result<toml::value_t,_toml::error_info> *)in_stack_fffffffffffff100,f);
      failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6df58c);
      error_info::~error_info((error_info *)in_stack_fffffffffffff100);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff100);
      std::allocator<char>::~allocator((allocator<char> *)&local_de1);
      location::~location((location *)in_stack_fffffffffffff100);
      either::~either((either *)in_stack_fffffffffffff100);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff100);
      std::allocator<char>::~allocator(local_d51);
    }
    else {
      plVar4 = local_be9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff147,
                          CONCAT16(in_stack_fffffffffffff146,in_stack_fffffffffffff140)),
                 in_stack_fffffffffffff138,in_stack_fffffffffffff130);
      syntax::floating(in_stack_fffffffffffff2d8);
      location::location(plVar4,in_stack_fffffffffffff118);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff147,
                          CONCAT16(in_stack_fffffffffffff146,in_stack_fffffffffffff140)),
                 in_stack_fffffffffffff138,in_stack_fffffffffffff130);
      make_syntax_error<toml::detail::either>
                (in_stack_fffffffffffff368,(either *)in_stack_fffffffffffff360._M_p,
                 (location *)in_stack_fffffffffffff358,(string *)in_stack_fffffffffffff350);
      err<toml::error_info>(in_stack_fffffffffffff158);
      result<toml::value_t,_toml::error_info>::result
                ((result<toml::value_t,_toml::error_info> *)in_stack_fffffffffffff100,
                 (failure_type *)in_stack_fffffffffffff0f8);
      failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6df339);
      error_info::~error_info((error_info *)in_stack_fffffffffffff100);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff100);
      std::allocator<char>::~allocator(local_c79);
      location::~location((location *)in_stack_fffffffffffff100);
      either::~either((either *)in_stack_fffffffffffff100);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff100);
      std::allocator<char>::~allocator((allocator<char> *)local_be9);
    }
    break;
  case 'T':
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff147,
                        CONCAT16(in_stack_fffffffffffff146,in_stack_fffffffffffff140)),
               in_stack_fffffffffffff138,in_stack_fffffffffffff130);
    syntax::boolean((spec *)in_stack_fffffffffffff158);
    location::location(in_stack_fffffffffffff120,in_stack_fffffffffffff118);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff147,
                        CONCAT16(in_stack_fffffffffffff146,in_stack_fffffffffffff140)),
               in_stack_fffffffffffff138,in_stack_fffffffffffff130);
    make_syntax_error<toml::detail::either>
              (in_stack_fffffffffffff368,(either *)in_stack_fffffffffffff360._M_p,
               (location *)in_stack_fffffffffffff358,(string *)in_stack_fffffffffffff350);
    err<toml::error_info>(in_stack_fffffffffffff158);
    result<toml::value_t,_toml::error_info>::result
              ((result<toml::value_t,_toml::error_info> *)in_stack_fffffffffffff100,
               (failure_type *)in_stack_fffffffffffff0f8);
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6de149);
    error_info::~error_info((error_info *)in_stack_fffffffffffff100);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff100);
    std::allocator<char>::~allocator(local_1e9);
    location::~location((location *)in_stack_fffffffffffff100);
    either::~either((either *)in_stack_fffffffffffff100);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff100);
    std::allocator<char>::~allocator(local_159);
    break;
  case '[':
    local_80 = 9;
    local_7f = (value_type)ok<toml::value_t>((value_t *)in_stack_fffffffffffff0f8);
    result<toml::value_t,_toml::error_info>::result(in_RDI,(success_type)local_7f);
    break;
  case 'f':
    local_86 = 1;
    local_85 = (value_type)ok<toml::value_t>((value_t *)in_stack_fffffffffffff0f8);
    result<toml::value_t,_toml::error_info>::result(in_RDI,(success_type)local_85);
    break;
  case 'i':
    literal::literal<4ul>
              ((literal *)in_stack_fffffffffffff100,(char (*) [4])in_stack_fffffffffffff0f8);
    literal::scan((literal *)
                  CONCAT17(in_stack_fffffffffffff17f,
                           CONCAT16(in_stack_fffffffffffff17e,in_stack_fffffffffffff178)),
                  in_stack_fffffffffffff170);
    bVar3 = region::is_ok((region *)0x6de55b);
    region::~region(in_stack_fffffffffffff100);
    literal::~literal((literal *)0x6de57c);
    if (bVar3) {
      local_3da = 3;
      local_3d9 = (value_type)ok<toml::value_t>((value_t *)in_stack_fffffffffffff0f8);
      result<toml::value_t,_toml::error_info>::result(in_RDI,(success_type)local_3d9);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff147,
                          CONCAT16(in_stack_fffffffffffff146,in_stack_fffffffffffff140)),
                 in_stack_fffffffffffff138,in_stack_fffffffffffff130);
      syntax::floating(in_stack_fffffffffffff2d8);
      location::location(in_stack_fffffffffffff120,in_stack_fffffffffffff118);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff147,
                          CONCAT16(in_stack_fffffffffffff146,in_stack_fffffffffffff140)),
                 in_stack_fffffffffffff138,in_stack_fffffffffffff130);
      make_syntax_error<toml::detail::either>
                (in_stack_fffffffffffff368,(either *)in_stack_fffffffffffff360._M_p,
                 (location *)in_stack_fffffffffffff358,(string *)in_stack_fffffffffffff350);
      err<toml::error_info>(in_stack_fffffffffffff158);
      result<toml::value_t,_toml::error_info>::result
                ((result<toml::value_t,_toml::error_info> *)in_stack_fffffffffffff100,
                 (failure_type *)in_stack_fffffffffffff0f8);
      failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6de706);
      error_info::~error_info((error_info *)in_stack_fffffffffffff100);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff100);
      std::allocator<char>::~allocator(local_541);
      location::~location((location *)in_stack_fffffffffffff100);
      either::~either((either *)in_stack_fffffffffffff100);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff100);
      std::allocator<char>::~allocator(local_4b1);
    }
    break;
  case 'n':
    if ((local_20->ext_null_value & 1U) == 0) {
      literal::literal<4ul>
                ((literal *)in_stack_fffffffffffff100,(char (*) [4])in_stack_fffffffffffff0f8);
      literal::scan((literal *)
                    CONCAT17(in_stack_fffffffffffff17f,
                             CONCAT16(in_stack_fffffffffffff17e,in_stack_fffffffffffff178)),
                    in_stack_fffffffffffff170);
      bVar2 = region::is_ok((region *)0x6def45);
      region::~region(in_stack_fffffffffffff100);
      literal::~literal((literal *)0x6def63);
      if ((bVar2 & 1) == 0) {
        __s = local_a81;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffff146,in_stack_fffffffffffff140)),
                   (char *)__s,in_stack_fffffffffffff130);
        syntax::floating(in_stack_fffffffffffff2d8);
        location::location(in_stack_fffffffffffff120,in_stack_fffffffffffff118);
        __a = local_b11;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffff146,in_stack_fffffffffffff140)),
                   (char *)__s,__a);
        make_syntax_error<toml::detail::either>
                  (in_stack_fffffffffffff368,(either *)in_stack_fffffffffffff360._M_p,
                   (location *)in_stack_fffffffffffff358,(string *)in_stack_fffffffffffff350);
        err<toml::error_info>(in_stack_fffffffffffff158);
        result<toml::value_t,_toml::error_info>::result
                  ((result<toml::value_t,_toml::error_info> *)in_stack_fffffffffffff100,
                   (failure_type *)in_stack_fffffffffffff0f8);
        failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6df0d2);
        error_info::~error_info((error_info *)in_stack_fffffffffffff100);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff100);
        std::allocator<char>::~allocator((allocator<char> *)local_b11);
        location::~location((location *)in_stack_fffffffffffff100);
        either::~either((either *)in_stack_fffffffffffff100);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff100);
        std::allocator<char>::~allocator(local_a81);
      }
      else {
        local_9aa = 3;
        local_9a9 = (value_type)ok<toml::value_t>((value_t *)in_stack_fffffffffffff0f8);
        result<toml::value_t,_toml::error_info>::result(in_RDI,(success_type)local_9a9);
      }
    }
    else {
      literal::literal<4ul>
                ((literal *)in_stack_fffffffffffff100,(char (*) [4])in_stack_fffffffffffff0f8);
      literal::scan((literal *)
                    CONCAT17(in_stack_fffffffffffff17f,
                             CONCAT16(in_stack_fffffffffffff17e,in_stack_fffffffffffff178)),
                    in_stack_fffffffffffff170);
      bVar2 = region::is_ok((region *)0x6deb2a);
      region::~region(in_stack_fffffffffffff100);
      literal::~literal((literal *)0x6deb4b);
      if ((bVar2 & 1) == 0) {
        plVar4 = &local_7b8;
        literal::literal<5ul>
                  ((literal *)in_stack_fffffffffffff100,(char (*) [5])in_stack_fffffffffffff0f8);
        literal::scan((literal *)
                      CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffff17e,in_stack_fffffffffffff178)),
                      plVar4);
        bVar3 = region::is_ok((region *)0x6dec13);
        region::~region(in_stack_fffffffffffff100);
        literal::~literal((literal *)0x6dec31);
        if (bVar3) {
          local_7ba = 0;
          local_7b9 = (value_type)ok<toml::value_t>((value_t *)in_stack_fffffffffffff0f8);
          result<toml::value_t,_toml::error_info>::result(in_RDI,(success_type)local_7b9);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff147,
                              CONCAT16(in_stack_fffffffffffff146,in_stack_fffffffffffff140)),
                     in_stack_fffffffffffff138,in_stack_fffffffffffff130);
          syntax::floating(in_stack_fffffffffffff2d8);
          location::location(in_stack_fffffffffffff120,in_stack_fffffffffffff118);
          v = &local_921;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff147,
                              CONCAT16(in_stack_fffffffffffff146,in_stack_fffffffffffff140)),
                     in_stack_fffffffffffff138,in_stack_fffffffffffff130);
          make_syntax_error<toml::detail::either>
                    (in_stack_fffffffffffff368,(either *)in_stack_fffffffffffff360._M_p,
                     (location *)in_stack_fffffffffffff358,(string *)in_stack_fffffffffffff350);
          err<toml::error_info>(v);
          result<toml::value_t,_toml::error_info>::result
                    ((result<toml::value_t,_toml::error_info> *)in_stack_fffffffffffff100,
                     (failure_type *)in_stack_fffffffffffff0f8);
          failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6deda0);
          error_info::~error_info((error_info *)in_stack_fffffffffffff100);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff100);
          std::allocator<char>::~allocator((allocator<char> *)&local_921);
          location::~location((location *)in_stack_fffffffffffff100);
          either::~either((either *)in_stack_fffffffffffff100);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff100);
          std::allocator<char>::~allocator(local_891);
        }
      }
      else {
        local_732 = 3;
        local_731 = (value_type)ok<toml::value_t>((value_t *)in_stack_fffffffffffff0f8);
        result<toml::value_t,_toml::error_info>::result(in_RDI,(success_type)local_731);
      }
    }
    break;
  case 't':
    local_84 = 1;
    local_83 = (value_type)ok<toml::value_t>((value_t *)in_stack_fffffffffffff0f8);
    result<toml::value_t,_toml::error_info>::result(in_RDI,(success_type)local_83);
    break;
  case '{':
    local_82 = 10;
    local_81 = (value_type)ok<toml::value_t>((value_t *)in_stack_fffffffffffff0f8);
    result<toml::value_t,_toml::error_info>::result(in_RDI,(success_type)local_81);
  }
  local_7c = 1;
  location::~location((location *)in_stack_fffffffffffff100);
  return in_RDI;
}

Assistant:

result<value_t, error_info>
guess_value_type(const location& loc, const context<TC>& ctx)
{
    const auto& sp = ctx.toml_spec();
    location inner(loc);

    switch(loc.current())
    {
        case '"' : {return ok(value_t::string);  }
        case '\'': {return ok(value_t::string);  }
        case '[' : {return ok(value_t::array);   }
        case '{' : {return ok(value_t::table);   }
        case 't' :
        {
            return ok(value_t::boolean);
        }
        case 'f' :
        {
            return ok(value_t::boolean);
        }
        case 'T' : // invalid boolean.
        {
            return err(make_syntax_error("toml::parse_value: "
                "`true` must be in lowercase. "
                "A string must be surrounded by quotes.",
                syntax::boolean(sp), inner));
        }
        case 'F' :
        {
            return err(make_syntax_error("toml::parse_value: "
                "`false` must be in lowercase. "
                "A string must be surrounded by quotes.",
                syntax::boolean(sp), inner));
        }
        case 'i' : // inf or string without quotes(syntax error).
        {
            if(literal("inf").scan(inner).is_ok())
            {
                return ok(value_t::floating);
            }
            else
            {
                return err(make_syntax_error("toml::parse_value: "
                    "`inf` must be in lowercase. "
                    "A string must be surrounded by quotes.",
                    syntax::floating(sp), inner));
            }
        }
        case 'I' : // Inf or string without quotes(syntax error).
        {
            return err(make_syntax_error("toml::parse_value: "
                "`inf` must be in lowercase. "
                "A string must be surrounded by quotes.",
                syntax::floating(sp), inner));
        }
        case 'n' : // nan or null-extension
        {
            if(sp.ext_null_value)
            {
                if(literal("nan").scan(inner).is_ok())
                {
                    return ok(value_t::floating);
                }
                else if(literal("null").scan(inner).is_ok())
                {
                    return ok(value_t::empty);
                }
                else
                {
                    return err(make_syntax_error("toml::parse_value: "
                        "Both `nan` and `null` must be in lowercase. "
                        "A string must be surrounded by quotes.",
                        syntax::floating(sp), inner));
                }
            }
            else // must be nan.
            {
                if(literal("nan").scan(inner).is_ok())
                {
                    return ok(value_t::floating);
                }
                else
                {
                    return err(make_syntax_error("toml::parse_value: "
                        "`nan` must be in lowercase. "
                        "A string must be surrounded by quotes.",
                        syntax::floating(sp), inner));
                }
            }
        }
        case 'N' : // nan or null-extension
        {
            if(sp.ext_null_value)
            {
                return err(make_syntax_error("toml::parse_value: "
                    "Both `nan` and `null` must be in lowercase. "
                    "A string must be surrounded by quotes.",
                    syntax::floating(sp), inner));
            }
            else
            {
                return err(make_syntax_error("toml::parse_value: "
                    "`nan` must be in lowercase. "
                    "A string must be surrounded by quotes.",
                    syntax::floating(sp), inner));
            }
        }
        default  :
        {
            return guess_number_type(loc, ctx);
        }
    }
}